

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O2

ostream * std::operator<<(ostream *ofs,vector<float,_std::allocator<float>_> *v)

{
  pointer pfVar1;
  size_t i;
  ulong uVar2;
  char buf [128];
  allocator local_d9;
  string local_d8 [32];
  char local_b8 [136];
  
  std::operator<<(ofs,"[");
  for (uVar2 = 0;
      pfVar1 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pfVar1 >> 2);
      uVar2 = uVar2 + 1) {
    if (uVar2 != 0) {
      std::operator<<(ofs,", ");
      pfVar1 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    floaxie::ftoa<float,char>(pfVar1[uVar2],local_b8);
    std::__cxx11::string::string(local_d8,local_b8,&local_d9);
    std::operator<<(ofs,local_d8);
    std::__cxx11::string::_M_dispose();
  }
  std::operator<<(ofs,"]");
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const std::vector<float> &v) {
  // Use floaxie
  char buf[128];

  // TODO: multi-threading for further performance gain?

  ofs << "[";
  for (size_t i = 0; i < v.size(); i++) {
    if (i > 0) {
      ofs << ", ";
    }
    floaxie::ftoa(v[i], buf);
    ofs << std::string(buf);
  }
  ofs << "]";

  return ofs;
}